

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

bool __thiscall
ON_Mesh::SeparateNgons(ON_Mesh *this,uint **vertex_face_map,uint ngon_index0,uint ngon_index1)

{
  bool bVar1;
  uint uVar2;
  uint ni;
  ON_MeshSeparateNgonInfo X;
  ON_MeshSeparateNgonInfo local_e0;
  
  uVar2 = (this->m_Ngon).m_count;
  if (uVar2 < ngon_index1) {
    ngon_index1 = uVar2;
  }
  if (ngon_index0 < ngon_index1) {
    ON_MeshSeparateNgonInfo::ON_MeshSeparateNgonInfo(&local_e0,this,vertex_face_map);
    bVar1 = ON_MeshSeparateNgonInfo::IsValid(&local_e0);
    if (bVar1) {
      do {
        if (ngon_index1 <= ngon_index0) {
          if (local_e0.m_vertex_count0 < local_e0.m_vertex_count1) {
            ON_MeshSeparateNgonInfo::DuplicateSharedNgonVertices(&local_e0);
          }
          uVar2 = VertexUnsignedCount(this);
          bVar1 = local_e0.m_vertex_count0 < uVar2;
          goto LAB_0053cf36;
        }
        bVar1 = ON_MeshSeparateNgonInfo::FindSharedNgonVertices(&local_e0,ngon_index0);
        ngon_index0 = ngon_index0 + 1;
      } while (bVar1);
    }
    bVar1 = false;
LAB_0053cf36:
    ON_MeshSeparateNgonInfo::~ON_MeshSeparateNgonInfo(&local_e0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Mesh::SeparateNgons(
  unsigned int** vertex_face_map,
  unsigned int ngon_index0,
  unsigned int ngon_index1
  )
{
  if ( ngon_index1 > NgonUnsignedCount() )
    ngon_index1 = NgonUnsignedCount();
  if ( ngon_index1 <= ngon_index0 )
    return false;

  ON_MeshSeparateNgonInfo X(this,vertex_face_map);
  if ( false == X.IsValid() )
    return false;

  // Count number of new vertices that are required
  // to separate the ngons and save a list of what
  // needs to be updated in "X".  This loop modifies
  // vertex_face_map[] by removing references
  // to faces of vertices that will be duplicated.
  for ( unsigned int ni = ngon_index0; ni < ngon_index1; ni++ )
  {
    if( false == X.FindSharedNgonVertices(ni) )
      return 0;
  }

  // Add new vertices to ngons.
  if ( X.m_vertex_count1 > X.m_vertex_count0 )
  {
    // Duplicate the shared vertices and update the
    // ngon and face vertex index lists to reference
    // the duplicated vertices.
    X.DuplicateSharedNgonVertices();
  }

  return (VertexUnsignedCount() > X.m_vertex_count0);
}